

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::sectionEnded
          (RunContext *this,SectionInfo *info,Counts *prevAssertions,double _durationInSeconds)

{
  IStreamingReporter *pIVar1;
  char cVar2;
  bool _missingAssertions;
  Counts diff;
  Counts local_e8;
  SectionStats local_c8;
  
  cVar2 = std::uncaught_exception();
  if (cVar2 == '\0') {
    local_e8.passed = (this->m_totals).assertions.passed - prevAssertions->passed;
    local_e8.failed = (this->m_totals).assertions.failed - prevAssertions->failed;
    local_e8.failedButOk = (this->m_totals).assertions.failedButOk - prevAssertions->failedButOk;
    _missingAssertions = testForMissingAssertions(this,&local_e8);
    SectionTracking::TestCaseTracker::leaveSection((this->m_testCaseTracker).nullableValue);
    pIVar1 = (this->m_reporter).m_p;
    SectionStats::SectionStats(&local_c8,info,&local_e8,_durationInSeconds,_missingAssertions);
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar1,&local_c8);
    SectionStats::~SectionStats(&local_c8);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  }
  else {
    SectionInfo::SectionInfo((SectionInfo *)&local_c8,info);
    local_c8.assertions.failed = prevAssertions->failedButOk;
    local_c8.sectionInfo.lineInfo.line = prevAssertions->passed;
    local_c8.assertions.passed = prevAssertions->failed;
    local_c8.assertions.failedButOk = (size_t)_durationInSeconds;
    std::
    vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
    ::emplace_back<Catch::RunContext::UnfinishedSections>
              (&this->m_unfinishedSections,(UnfinishedSections *)&local_c8);
    SectionInfo::~SectionInfo((SectionInfo *)&local_c8);
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionInfo const& info, Counts const& prevAssertions, double _durationInSeconds ) {
            if( std::uncaught_exception() ) {
                m_unfinishedSections.push_back( UnfinishedSections( info, prevAssertions, _durationInSeconds ) );
                return;
            }

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            m_testCaseTracker->leaveSection();

            m_reporter->sectionEnded( SectionStats( info, assertions, _durationInSeconds, missingAssertions ) );
            m_messages.clear();
        }